

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O1

void Gia_ManCheckFalseOne
               (Gia_Man_t *p,int iOut,int nTimeOut,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  lit *begin;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar8;
  long lVar9;
  sat_solver *s;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar0;
  long lVar14;
  abctime aVar15;
  int iVar16;
  long lVar17;
  Gia_Obj_t *pGVar18;
  uint *puVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  timespec ts;
  int iFanin;
  undefined8 in_stack_ffffffffffffff48;
  timespec local_78;
  Vec_Int_t *local_68;
  int local_5c;
  uint local_58;
  int local_54;
  Vec_Wec_t *local_50;
  long local_48;
  Vec_Int_t *local_40;
  int local_34;
  
  pGVar18 = (Gia_Obj_t *)(ulong)(uint)fVerbose;
  if (iOut < 0) {
LAB_006d4a8a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (p->vCos->nSize <= iOut) goto LAB_006d4a8a;
  iVar3 = p->vCos->pArray[(uint)iOut];
  local_54 = fVerbose;
  if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_006d4a6b:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pObj = p->pObjs + iVar3;
  iVar3 = p->nLevels;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar11 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar7;
  local_50 = vHooks;
  __ptr = Gia_ManCollectPath(p,pObj);
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pGVar2 = p->pObjs;
  local_58 = iOut;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    local_34 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555 -
               (*(uint *)pObj & 0x1fffffff);
    pVVar8 = Gia_ManCollectNodesCis(p,&local_34,1);
    uVar13 = pVVar8->nSize;
    lVar9 = (long)(int)uVar13;
    if (0 < lVar9) {
      piVar7 = pVVar8->pArray;
      lVar17 = 0;
      do {
        uVar13 = uVar13 - 1;
        iVar3 = piVar7[lVar17];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_006d4a6b;
        pGVar18 = p->pObjs;
        if (pGVar18 == (Gia_Obj_t *)0x0) break;
        pGVar18[iVar3].Value = uVar13;
        lVar17 = lVar17 + 1;
      } while (lVar9 != lVar17);
    }
    if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pPivot)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                    ,0xb6,"void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
      ;
    }
    s = sat_solver_new();
    local_68 = pVVar6;
    local_5c = fVeryVerbose;
    local_48 = lVar14;
    if (nTimeOut == 0) {
      aVar15 = 0;
    }
    else {
      iVar3 = clock_gettime(3,&local_78);
      if (iVar3 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      aVar15 = lVar14 + (long)nTimeOut * 1000000;
    }
    s->nRuntimeLimit = aVar15;
    sat_solver_setnvars(s,__ptr->nSize * 3 + pVVar8->nSize * 2);
    iVar3 = __ptr->nSize * 3;
    iVar11 = iVar3 + pVVar8->nSize;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        iVar16 = pVVar8->pArray[lVar14];
        if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_006d4a6b;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar16;
        uVar10 = *(ulong *)pGVar2;
        if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
          sat_solver_add_and(s,pGVar2->Value + iVar3,pGVar2[-(uVar10 & 0x1fffffff)].Value + iVar3,
                             pGVar2[-(uVar10 >> 0x20 & 0x1fffffff)].Value + iVar3,
                             (uint)(uVar10 >> 0x1d) & 1,(uint)(uVar10 >> 0x3d) & 1,
                             (int)in_stack_ffffffffffffff48);
          uVar10 = *(ulong *)pGVar2;
          pGVar18 = (Gia_Obj_t *)0x0;
          sat_solver_add_and(s,pGVar2->Value + iVar11,pGVar2[-(uVar10 & 0x1fffffff)].Value + iVar11,
                             pGVar2[-(uVar10 >> 0x20 & 0x1fffffff)].Value + iVar11,
                             (uint)(uVar10 >> 0x1d) & 1,(uint)(uVar10 >> 0x3d) & 1,
                             (int)in_stack_ffffffffffffff48);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar8->nSize);
    }
    uVar10 = (ulong)(uint)__ptr->nSize;
    local_40 = pVVar8;
    if (0 < __ptr->nSize) {
      iVar16 = 0;
      lVar14 = 0;
      do {
        iVar21 = __ptr->pArray[lVar14];
        if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) goto LAB_006d4a6b;
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar1 = pGVar2 + iVar21;
        uVar22 = *(ulong *)pGVar1;
        uVar13 = (uint)uVar22;
        pGVar18 = (Gia_Obj_t *)CONCAT71((int7)((ulong)pGVar18 >> 8),(int)uVar13 < 0);
        iVar21 = (int)lVar14;
        if ((uVar22 & 0x1fffffff) == 0x1fffffff || (int)uVar13 < 0) {
          if ((~uVar13 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                          ,0xe7,
                          "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
            ;
          }
          sat_solver_add_xor(s,iVar21,pGVar1->Value + iVar3,pGVar1->Value + iVar11,(int)pGVar18);
        }
        else {
          if (lVar14 == 0) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                          ,0xce,
                          "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
            ;
          }
          iVar4 = (int)uVar10;
          if (iVar4 < lVar14) goto LAB_006d4a8a;
          iVar12 = __ptr->pArray[lVar14 + -1];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_006d4a6b;
          uVar13 = (uint)(uVar22 >> 0x20);
          if (pGVar2 + iVar12 == pGVar1 + -(uVar22 & 0x1fffffff)) {
            sat_solver_add_and(s,iVar21 + iVar4,iVar21 + iVar4 + -1,
                               pGVar1[-(uVar22 >> 0x20 & 0x1fffffff)].Value + iVar3,
                               (uint)(uVar22 >> 0x1d) & 1,uVar13 >> 0x1d & 1,
                               (int)in_stack_ffffffffffffff48);
            iVar4 = __ptr->nSize;
            iVar0 = iVar21 + iVar4 * 2 + -1;
            uVar10 = *(ulong *)pGVar1;
            iVar12 = pGVar1[-(uVar10 >> 0x20 & 0x1fffffff)].Value + iVar11;
          }
          else {
            if (pGVar2 + iVar12 != pGVar1 + -(ulong)(uVar13 & 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                            ,0xe2,
                            "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)"
                           );
            }
            sat_solver_add_and(s,iVar21 + iVar4,pGVar1[-(uVar22 & 0x1fffffff)].Value + iVar3,
                               iVar21 + iVar4 + -1,(uint)(uVar22 >> 0x1d) & 1,uVar13 >> 0x1d & 1,
                               (int)in_stack_ffffffffffffff48);
            iVar4 = __ptr->nSize;
            uVar10 = *(ulong *)pGVar1;
            iVar0 = pGVar1[-(ulong)((uint)uVar10 & 0x1fffffff)].Value + iVar11;
            iVar12 = iVar21 + iVar4 * 2 + -1;
          }
          uVar13 = (uint)(uVar10 >> 0x1d) & 1;
          pGVar18 = (Gia_Obj_t *)(ulong)uVar13;
          sat_solver_add_and(s,iVar21 + iVar4 * 2,iVar0,iVar12,uVar13,(uint)(uVar10 >> 0x3d) & 1,
                             (int)in_stack_ffffffffffffff48);
          sat_solver_add_xor(s,iVar21,iVar21 + __ptr->nSize,iVar21 + __ptr->nSize * 2,(int)pGVar18);
        }
        Vec_IntPush(local_68,iVar16);
        lVar14 = lVar14 + 1;
        uVar10 = (ulong)__ptr->nSize;
        iVar16 = iVar16 + 2;
      } while (lVar14 < (long)uVar10);
    }
    pVVar6 = local_68;
    begin = local_68->pArray;
    puVar19 = (uint *)0x0;
    iVar3 = sat_solver_solve(s,begin,begin + local_68->nSize,(long)nTimeOut,0,0,0);
    uVar10 = 0;
    if (iVar3 == -1) {
      puVar19 = (uint *)(s->conf_final).ptr;
      uVar10 = (ulong)(s->conf_final).size;
      if (((int)puVar19[uVar10 - 1] < 0) || ((int)*puVar19 < 0)) goto LAB_006d4ae7;
      uVar13 = puVar19[uVar10 - 1] >> 1;
      uVar20 = *puVar19 >> 1;
      if ((int)(uVar20 - uVar13) < 0x14) {
        uVar5 = 1;
        if (1 < uVar13) {
          uVar5 = uVar13;
        }
        uVar13 = uVar5 - 1;
        bVar23 = (int)uVar20 < (int)uVar13;
        if ((int)uVar13 <= (int)uVar20) {
          uVar22 = (ulong)uVar13;
          iVar11 = (uVar20 - uVar5) + 2;
          do {
            if ((long)__ptr->nSize <= (long)uVar22) goto LAB_006d4a8a;
            iVar16 = __ptr->pArray[uVar22];
            if (((long)iVar16 < 0) || (local_50->nSize <= iVar16)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                            ,0xd1,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
            }
            if (0 < local_50->pArray[iVar16].nSize) {
              if (!bVar23) goto LAB_006d4821;
              break;
            }
            bVar23 = uVar20 <= uVar22;
            uVar22 = uVar22 + 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        if (__ptr->nSize <= (int)uVar20) goto LAB_006d4a8a;
        iVar11 = __ptr->pArray[uVar20];
        if (((long)iVar11 < 0) || (local_50->nSize <= iVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if ((int)uVar13 <= (int)uVar20) {
          pVVar8 = local_50->pArray;
          uVar22 = (ulong)uVar13;
          iVar16 = (uVar20 - uVar5) + 2;
          do {
            if ((long)__ptr->nSize <= (long)uVar22) goto LAB_006d4a8a;
            Vec_IntPush(pVVar8 + iVar11,__ptr->pArray[uVar22]);
            uVar22 = uVar22 + 1;
            iVar16 = iVar16 + -1;
            pVVar6 = local_68;
          } while (iVar16 != 0);
        }
      }
    }
LAB_006d4821:
    if (local_54 != 0) {
      pGVar18 = p->pObjs;
      if ((pObj < pGVar18) || (pGVar18 + p->nObjs <= pObj)) goto LAB_006d4b06;
      uVar13 = Gia_ObjLevelId(p,(int)((ulong)((long)pObj - (long)pGVar18) >> 2) * -0x55555555);
      printf("PO %6d : Level = %3d  ",(ulong)local_58,(ulong)uVar13);
      if (iVar3 == 1) {
        printf("There is no false path. ");
      }
      else if (iVar3 == 0) {
        printf("Timeout reached after %d seconds. ",(ulong)(uint)nTimeOut);
      }
      else {
        printf("False path contains %d nodes (out of %d):  ",uVar10,(ulong)(uint)__ptr->nSize);
        if ((int)*puVar19 < 0) {
LAB_006d4ae7:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar13 = *puVar19 >> 1;
        if (__ptr->nSize <= (int)uVar13) goto LAB_006d4a8a;
        printf("top = %d  ",(ulong)(uint)__ptr->pArray[uVar13]);
        if (0 < (int)uVar10 && local_5c != 0) {
          uVar22 = 0;
          do {
            if ((int)puVar19[uVar22] < 0) goto LAB_006d4ae7;
            printf("%d ",(ulong)(puVar19[uVar22] >> 1));
            uVar22 = uVar22 + 1;
          } while ((uVar10 & 0xffffffff) != uVar22);
        }
        printf("  ");
      }
      iVar11 = 3;
      iVar3 = clock_gettime(3,&local_78);
      if (iVar3 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      lVar14 = lVar14 + local_48;
      Abc_Print(iVar11,"%s =","Time");
      Abc_Print(iVar11,"%9.2f sec\n",(double)lVar14 / 1000000.0);
    }
    sat_solver_delete(s);
    pVVar8 = local_40;
    if (local_40->pArray != (int *)0x0) {
      free(local_40->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    if (pVVar8 != (Vec_Int_t *)0x0) {
      free(pVVar8);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    if (begin != (lit *)0x0) {
      free(begin);
      pVVar6->pArray = (int *)0x0;
    }
    free(pVVar6);
    return;
  }
LAB_006d4b06:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManCheckFalseOne( Gia_Man_t * p, int iOut, int nTimeOut, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pPivot = Gia_ManCo( p, iOut );
    Vec_Int_t * vLits = Vec_IntAlloc( p->nLevels );
    Vec_Int_t * vPath = Gia_ManCollectPath( p, pPivot );
    int nLits = 0, * pLits = NULL;
    int i, Shift[2], status;
    abctime clkStart = Abc_Clock();
    // collect objects and assign SAT variables
    int iFanin = Gia_ObjFaninId0p( p, pPivot );
    Vec_Int_t * vObjs = Gia_ManCollectNodesCis( p, &iFanin, 1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->Value = Vec_IntSize(vObjs) - 1 - i;
    assert( Gia_ObjIsCo(pPivot) );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_setnvars( pSat, 3 * Vec_IntSize(vPath) + 2 * Vec_IntSize(vObjs) );
    Shift[0] = 3 * Vec_IntSize(vPath);
    Shift[1] = 3 * Vec_IntSize(vPath) + Vec_IntSize(vObjs);
    // add CNF for the cone
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        sat_solver_add_and( pSat, pObj->Value + Shift[0], 
            Gia_ObjFanin0(pObj)->Value + Shift[0], Gia_ObjFanin1(pObj)->Value + Shift[0], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
        sat_solver_add_and( pSat, pObj->Value + Shift[1], 
            Gia_ObjFanin0(pObj)->Value + Shift[1], Gia_ObjFanin1(pObj)->Value + Shift[1], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
    }
    // add CNF for the path
    Gia_ManForEachObjVec( vPath, p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            assert( i > 0 );
            pFanin = Gia_ManObj( p, Vec_IntEntry(vPath, i-1) );
            if ( pFanin == Gia_ObjFanin0(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    i-1 + 1*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[0], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    i-1 + 2*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[1], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else if ( pFanin == Gia_ObjFanin1(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[0], i-1 + 1*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[1], i-1 + 2*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else assert( 0 );
            sat_solver_add_xor( pSat, i, i + 1*Vec_IntSize(vPath), i + 2*Vec_IntSize(vPath), 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
            sat_solver_add_xor( pSat, i, pObj->Value + Shift[0], pObj->Value + Shift[1], 0 );
        else assert( 0 );
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
    }
    // call the SAT solver
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)nTimeOut, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        int iBeg, iEnd;
        nLits = sat_solver_final( pSat, &pLits );
        iBeg  = Abc_Lit2Var(pLits[nLits-1]);
        iEnd  = Abc_Lit2Var(pLits[0]);
        if ( iEnd - iBeg < 20 )
        {
            // check if nodes on the path are already used
            for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                if ( Vec_WecLevelSize(vHooks, Vec_IntEntry(vPath, i)) > 0 )
                    break;
            if ( i > iEnd )
            {
                Vec_Int_t * vHook = Vec_WecEntry(vHooks, Vec_IntEntry(vPath, iEnd));
                for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                    Vec_IntPush( vHook, Vec_IntEntry(vPath, i) );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "PO %6d : Level = %3d  ", iOut, Gia_ObjLevel(p, pPivot) );
        if ( status == l_Undef )
            printf( "Timeout reached after %d seconds. ", nTimeOut );
        else if ( status == l_True )
            printf( "There is no false path. " );
        else
        {
            printf( "False path contains %d nodes (out of %d):  ", nLits, Vec_IntSize(vPath) );
            printf( "top = %d  ", Vec_IntEntry(vPath, Abc_Lit2Var(pLits[0])) );
            if ( fVeryVerbose )
                for ( i = 0; i < nLits; i++ )
                    printf( "%d ", Abc_Lit2Var(pLits[i]) );
            printf( "  " );
        }
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vObjs );
    Vec_IntFree( vPath );
    Vec_IntFree( vLits );
}